

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_lnspec.cpp
# Opt level: O0

int LS_Thing_ChangeTID(line_t *ln,AActor *it,bool backSide,int arg0,int arg1,int arg2,int arg3,
                      int arg4)

{
  AActor *pAVar1;
  AActor *local_48;
  AActor *next;
  AActor *actor;
  FActorIterator iterator;
  int arg2_local;
  int arg1_local;
  int arg0_local;
  bool backSide_local;
  AActor *it_local;
  line_t *ln_local;
  
  iterator.id = arg2;
  iterator._12_4_ = arg1;
  if (arg0 == 0) {
    if ((it != (AActor *)0x0) && (((it->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0)) {
      AActor::RemoveFromHash(it);
      it->tid = iterator._12_4_;
      AActor::AddToHash(it);
    }
  }
  else {
    FActorIterator::FActorIterator((FActorIterator *)&actor,arg0);
    pAVar1 = FActorIterator::Next((FActorIterator *)&actor);
    while (local_48 = pAVar1, local_48 != (AActor *)0x0) {
      pAVar1 = FActorIterator::Next((FActorIterator *)&actor);
      if (((local_48->super_DThinker).super_DObject.ObjectFlags & 0x20) == 0) {
        AActor::RemoveFromHash(local_48);
        local_48->tid = iterator._12_4_;
        AActor::AddToHash(local_48);
      }
    }
  }
  return 1;
}

Assistant:

FUNC(LS_Thing_ChangeTID)
// Thing_ChangeTID (oldtid, newtid)
{
	if (arg0 == 0)
	{
		if (it != NULL && !(it->ObjectFlags & OF_EuthanizeMe))
		{
			it->RemoveFromHash ();
			it->tid = arg1;
			it->AddToHash ();
		}
	}
	else
	{
		FActorIterator iterator (arg0);
		AActor *actor, *next;

		next = iterator.Next ();
		while (next != NULL)
		{
			actor = next;
			next = iterator.Next ();

			if (!(actor->ObjectFlags & OF_EuthanizeMe))
			{
				actor->RemoveFromHash ();
				actor->tid = arg1;
				actor->AddToHash ();
			}
		}
	}
	return true;
}